

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArithmeticSubtermGeneralization.cpp
# Opt level: O1

Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> * __thiscall
Inferences::intersectSortedStack<Inferences::AnyNumber<Kernel::MonomFactor>>
          (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *__return_storage_ptr__,
          Inferences *this,Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *l,
          Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *r)

{
  ResultOf<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3),_Constant<0>_>
  RVar1;
  type tVar2;
  ulong uVar3;
  AnyNumber<Kernel::MonomFactor> *pAVar4;
  AnyNumber<Kernel::MonomFactor> *pAVar5;
  long lVar6;
  RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
  *this_00;
  Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *pSVar7;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
  *pRVar11;
  anon_class_16_2_fd512dd3 f;
  anon_class_16_2_f84bbffd f_00;
  uint local_4c;
  anon_class_8_1_ba1d745d_conflict2 local_38;
  
  pAVar5 = *(AnyNumber<Kernel::MonomFactor> **)(this + 8);
  pAVar4 = *(AnyNumber<Kernel::MonomFactor> **)(this + 0x10);
  uVar3 = (long)pAVar4 - (long)pAVar5;
  pSVar7 = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)this;
  if (pAVar4 != pAVar5) {
    pAVar5 = l->_stack;
    pAVar4 = l->_cursor;
    pSVar7 = l;
    if (pAVar4 != pAVar5) {
      pSVar7 = (Stack<Inferences::AnyNumber<Kernel::MonomFactor>_> *)this;
      if ((ulong)((long)pAVar4 - (long)pAVar5) < uVar3) {
        pSVar7 = l;
      }
      lVar6 = *(long *)(this + 8);
      uVar3 = 0;
      if (*(long *)(this + 0x10) != lVar6) {
        uVar9 = 0;
        uVar8 = 0;
        local_4c = 0;
        do {
          pAVar4 = l->_stack;
          if ((ulong)((long)l->_cursor - (long)pAVar4 >> 5) <= uVar3) break;
          lVar10 = uVar9 * 0x20;
          if (((*(byte *)&pAVar4[uVar3].
                          super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                          ._inner.
                          super_DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>
                          .
                          super_RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
               ^ *(byte *)(lVar6 + lVar10)) & 3) == 0) {
            local_38.rhs = &pAVar4[uVar3].
                            super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
            ;
            f.f = &local_38;
            f.this = (Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                      *)(lVar6 + lVar10);
            RVar1 = ::Lib::CoproductImpl::
                    RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                    ::
                    switchN<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_Lib_Coproduct_hpp:601:3)>
                              ((RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                *)(lVar6 + lVar10),f);
            if (!RVar1) goto LAB_004a398e;
            pRVar11 = (RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                       *)(lVar10 + *(long *)(this + 8));
            this_00 = (RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                       *)(pSVar7->_stack + local_4c);
            if (this_00 != pRVar11) {
              *(undefined8 *)(this_00 + 0x10) = 0;
              *(undefined8 *)(this_00 + 0x18) = 0;
              *(undefined8 *)this_00 = 0;
              *(undefined8 *)(this_00 + 8) = 0;
              *this_00 = (RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
                          )((byte)*pRVar11 & 3);
              f_00.other = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                            *)pRVar11;
              f_00.this = (DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                           *)this_00;
              ::Lib::CoproductImpl::
              RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>
              ::
              switchN<Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>::DefaultImpl(Lib::CoproductImpl::TrivialOperations::CopyCons::DefaultImpl<Lib::CoproductImpl::TrivialOperations::MoveCons::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>>const&)::_lambda(auto:1)_1_>
                        (this_00,f_00);
            }
            local_4c = local_4c + 1;
            uVar8 = uVar8 + 1;
LAB_004a39a6:
            uVar3 = (ulong)((int)uVar3 + 1);
          }
          else {
LAB_004a398e:
            tVar2 = ::Lib::DefaultComparator::
                    compare<Lib::Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>>,Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>>>>
                              ((Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                                *)(lVar10 + *(long *)(this + 8)),
                               &l->_stack[uVar3].
                                super_Coproduct<Kernel::MonomFactor<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Kernel::MonomFactor<Kernel::NumTraits<Kernel::RealConstantType>_>_>
                              );
            if (tVar2 != LESS) goto LAB_004a39a6;
            uVar8 = uVar8 + 1;
          }
          uVar9 = (ulong)uVar8;
          lVar6 = *(long *)(this + 8);
        } while (uVar9 < (ulong)(*(long *)(this + 0x10) - lVar6 >> 5));
        uVar3 = (ulong)local_4c;
      }
      pAVar5 = pSVar7->_stack;
      pAVar4 = pAVar5 + uVar3;
      pSVar7->_cursor = pAVar4;
    }
  }
  __return_storage_ptr__->_cursor = (AnyNumber<Kernel::MonomFactor> *)0x0;
  __return_storage_ptr__->_end = (AnyNumber<Kernel::MonomFactor> *)0x0;
  __return_storage_ptr__->_capacity = 0;
  __return_storage_ptr__->_stack = (AnyNumber<Kernel::MonomFactor> *)0x0;
  __return_storage_ptr__->_capacity = pSVar7->_capacity;
  pSVar7->_capacity = 0;
  __return_storage_ptr__->_cursor = pAVar4;
  pSVar7->_cursor = (AnyNumber<Kernel::MonomFactor> *)0x0;
  pAVar4 = __return_storage_ptr__->_end;
  __return_storage_ptr__->_end = pSVar7->_end;
  pSVar7->_end = pAVar4;
  pAVar4 = __return_storage_ptr__->_stack;
  __return_storage_ptr__->_stack = pAVar5;
  pSVar7->_stack = pAVar4;
  return __return_storage_ptr__;
}

Assistant:

Stack<C> intersectSortedStack(Stack<C>&& l, Stack<C>&& r) 
{
  // DEBUG("lhs: ", l)
  // DEBUG("rhs: ", r)

  if (l.size() == 0) return std::move(l);
  if (r.size() == 0) return std::move(r);

  unsigned outOffs = 0;
  auto& out = l.size() <= r.size() ? l : r;
  unsigned loffs = 0;
  unsigned roffs = 0;
  while (loffs < l.size() && roffs < r.size()) {
    if (l[loffs] == r[roffs]) {
      out[outOffs++] = l[loffs];
      loffs++;
      roffs++;
    } else if(l[loffs] < r[roffs]) {
      loffs++;
    } else {
      roffs++;
    }
  }
  
  out.truncate(outOffs);
  //DEBUG("out: ", out);
  return std::move(out);
}